

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::PickElement::backward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  Scalar *pSVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  uint bid;
  ulong uVar4;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  if (i != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                  ,0x625,
                  "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (this->pval == (uint *)0x0) {
    pvVar3 = this->pvals;
    if (pvVar3 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                    ,0x62c,
                    "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    for (bid = 0; uVar4 = (ulong)bid,
        uVar4 < (ulong)((long)(pvVar3->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar3->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2); bid = bid + 1) {
      fVar1 = dEdf->v[uVar4];
      Tensor::batch_matrix(&local_48,dEdxi,bid);
      pSVar2 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&local_48,
                            (ulong)(this->pvals->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar4]);
      *pSVar2 = fVar1 + *pSVar2;
      pvVar3 = this->pvals;
    }
  }
  else {
    fVar1 = *dEdf->v;
    Tensor::operator*(&local_48,dEdxi);
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)&local_48,(ulong)*this->pval);
    *pSVar2 = fVar1 + *pSVar2;
  }
  return;
}

Assistant:

void PickElement::backward_impl(const vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  if(pval) {
    (*dEdxi)(*pval) += dEdf.v[0];
  } else {
    assert(pvals);
    for(unsigned b = 0; b < pvals->size(); ++b)
      dEdxi.batch_matrix(b)((*pvals)[b]) += dEdf.v[b];
  }
#endif
}